

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

void __thiscall ON_3dPoint::ON_3dPoint(ON_3dPoint *this,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = p->w;
  dVar2 = (double)(~-(ulong)(dVar1 != 1.0) & 0x3ff0000000000000 |
                  (~-(ulong)(dVar1 != 0.0) & 0x3ff0000000000000 |
                  (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0)) & -(ulong)(dVar1 != 1.0));
  dVar3 = p->y;
  dVar1 = p->z;
  this->x = dVar2 * p->x;
  this->y = dVar2 * dVar3;
  this->z = dVar2 * dVar1;
  return;
}

Assistant:

ON_3dPoint::ON_3dPoint(const ON_4dPoint& p)
{
  x=p.x;y=p.y;z=p.z;
  const double w = (p.w != 1.0 && p.w != 0.0) ? 1.0/p.w : 1.0;
  x *= w;
  y *= w;
  z *= w;
}